

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primrefgen_presplit.h
# Opt level: O1

PrimInfo * __thiscall
embree::sse2::createPrimRefArray_presplit<embree::QuadMesh,embree::sse2::QuadSplitterFactory>
          (PrimInfo *__return_storage_ptr__,sse2 *this,Geometry *geometry,uint geomID,
          size_t numPrimRefs,mvector<PrimRef> *prims,BuildProgressMonitor *progressMonitor)

{
  size_t sVar1;
  char cVar2;
  int iVar3;
  unsigned_long uVar4;
  runtime_error *prVar5;
  undefined4 in_register_0000000c;
  ulong uVar6;
  size_t *psVar7;
  size_t *psVar8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar9;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar10;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar11;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar12;
  size_t sVar13;
  size_t sVar14;
  size_t taskCount;
  task_group_context context;
  ParallelPrefixSumState<embree::PrimInfoT<embree::BBox<embree::Vec3fa>_>_> pstate;
  auto_partitioner local_2939;
  unsigned_long local_2938;
  ulong local_2930;
  unsigned_long local_2928;
  uint local_291c;
  Geometry *local_2918;
  mvector<PrimRef> *local_2910;
  long local_2908;
  anon_class_8_1_898bcfc2_conflict4 local_2900;
  anon_class_24_3_3a534e91 local_28f8;
  anon_class_40_5_11684cf9 local_28e0;
  task_group_context local_28b8;
  ParallelPrefixSumState<embree::PrimInfoT<embree::BBox<embree::Vec3fa>_>_> local_2838;
  
  local_2908 = CONCAT44(in_register_0000000c,geomID);
  local_291c = (uint)geometry;
  local_2918 = (Geometry *)this;
  (*(code *)((prims->alloc).device)->_vptr_MemoryMonitorInterface)(prims,0);
  local_2930 = (ulong)local_2918->numPrimitives;
  local_2928 = 0;
  local_2910 = (mvector<PrimRef> *)numPrimRefs;
  local_28f8.geometry = &local_2918;
  local_28f8.prims = (mvector<PrimRef> *)numPrimRefs;
  local_28f8.geomID = &local_291c;
  iVar3 = tbb::detail::r1::max_concurrency((task_arena_base *)0x0);
  uVar6 = (local_2930 - local_2928) + 0x3ff >> 10;
  if ((ulong)(long)iVar3 < uVar6) {
    uVar6 = (long)iVar3;
  }
  uVar4 = 0x40;
  if (uVar6 < 0x40) {
    uVar4 = uVar6;
  }
  local_28e0.taskCount = &local_2938;
  local_28b8.my_version = proxy_support;
  local_28b8.my_traits = (context_traits)0x4;
  local_28b8.my_node.my_prev_node = (intrusive_list_node *)0x0;
  local_28b8.my_node.my_next_node = (intrusive_list_node *)0x0;
  local_28b8.my_name = CUSTOM_CTX;
  local_2938 = uVar4;
  local_28e0.first = &local_2928;
  local_28e0.last = &local_2930;
  local_28e0.state = &local_2838;
  local_28e0.func = &local_28f8;
  tbb::detail::r1::initialize(&local_28b8);
  local_2900.func = &local_28e0;
  tbb::detail::d1::
  parallel_for_impl<unsigned_long,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_bvh____builders_______common_algorithms_parallel_for_h:32:43),_const_tbb::detail::d1::auto_partitioner>
            (0,uVar4,1,&local_2900,&local_2939,&local_28b8);
  cVar2 = tbb::detail::r1::is_group_execution_cancelled(&local_28b8);
  if (cVar2 != '\0') {
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar5,"task cancelled");
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  tbb::detail::r1::destroy(&local_28b8);
  aVar9 = _DAT_01feb9f0;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0 =
       _DAT_01feb9f0;
  aVar10 = _DAT_01feba00;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0 =
       _DAT_01feba00;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0 =
       aVar9;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0 =
       aVar10;
  __return_storage_ptr__->begin = 0;
  __return_storage_ptr__->end = 0;
  aVar11 = aVar10;
  aVar12 = aVar9;
  if (local_2938 != 0) {
    psVar8 = &__return_storage_ptr__->begin;
    sVar13 = *psVar8;
    sVar14 = __return_storage_ptr__->end;
    psVar7 = &local_2838.sums[0].begin;
    uVar4 = local_2938;
    do {
      *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(psVar7 + -8) = aVar9;
      *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(psVar7 + -6) = aVar10;
      *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(psVar7 + -4) = aVar12;
      *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(psVar7 + -2) = aVar11;
      sVar1 = __return_storage_ptr__->end;
      *psVar7 = *psVar8;
      psVar7[1] = sVar1;
      aVar9.m128 = (__m128)minps(aVar9.m128,*(undefined1 (*) [16])(psVar7 + -0x288));
      aVar10.m128 = (__m128)maxps(aVar10.m128,*(undefined1 (*) [16])(psVar7 + -0x286));
      aVar12.m128 = (__m128)minps(aVar12.m128,*(undefined1 (*) [16])(psVar7 + -0x284));
      aVar11.m128 = (__m128)maxps(aVar11.m128,*(undefined1 (*) [16])(psVar7 + -0x282));
      sVar13 = sVar13 + psVar7[-0x280];
      sVar14 = sVar14 + psVar7[-0x27f];
      *psVar8 = sVar13;
      __return_storage_ptr__->end = sVar14;
      psVar7 = psVar7 + 10;
      uVar4 = uVar4 - 1;
    } while (uVar4 != 0);
  }
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0 =
       aVar9;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0 =
       aVar10;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0 =
       aVar12;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0 =
       aVar11;
  if (__return_storage_ptr__->end - __return_storage_ptr__->begin != local_2908) {
    (*(code *)((prims->alloc).device)->_vptr_MemoryMonitorInterface)(prims,0);
    local_2930 = (ulong)local_2918->numPrimitives;
    local_28f8.geometry = &local_2918;
    local_28f8.prims = local_2910;
    local_28f8.geomID = &local_291c;
    local_2928 = 0;
    iVar3 = tbb::detail::r1::max_concurrency((task_arena_base *)0x0);
    uVar6 = (local_2930 - local_2928) + 0x3ff >> 10;
    if ((ulong)(long)iVar3 < uVar6) {
      uVar6 = (long)iVar3;
    }
    uVar4 = 0x40;
    if (uVar6 < 0x40) {
      uVar4 = uVar6;
    }
    local_28e0.first = &local_2928;
    local_28e0.last = &local_2930;
    local_28e0.taskCount = &local_2938;
    local_28e0.func = &local_28f8;
    local_28b8.my_version = proxy_support;
    local_28b8.my_traits = (context_traits)0x4;
    local_28b8.my_node.my_prev_node = (intrusive_list_node *)0x0;
    local_28b8.my_node.my_next_node = (intrusive_list_node *)0x0;
    local_28b8.my_name = CUSTOM_CTX;
    local_2938 = uVar4;
    local_28e0.state = &local_2838;
    tbb::detail::r1::initialize(&local_28b8);
    local_2900.func = &local_28e0;
    tbb::detail::d1::
    parallel_for_impl<unsigned_long,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_bvh____builders_______common_algorithms_parallel_for_h:32:43),_const_tbb::detail::d1::auto_partitioner>
              (0,uVar4,1,&local_2900,&local_2939,&local_28b8);
    cVar2 = tbb::detail::r1::is_group_execution_cancelled(&local_28b8);
    if (cVar2 != '\0') {
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar5,"task cancelled");
      __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    tbb::detail::r1::destroy(&local_28b8);
    aVar9 = _DAT_01feb9f0;
    aVar10 = _DAT_01feba00;
    aVar11 = _DAT_01feba00;
    aVar12 = _DAT_01feb9f0;
    if (local_2938 == 0) {
      sVar13 = 0;
      sVar14 = 0;
    }
    else {
      psVar8 = &local_2838.sums[0].end;
      sVar14 = 0;
      sVar13 = 0;
      do {
        *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(psVar8 + -9) = aVar12;
        *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(psVar8 + -7) = aVar11;
        *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(psVar8 + -5) = aVar9;
        *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(psVar8 + -3) = aVar10;
        psVar8[-1] = sVar13;
        *psVar8 = sVar14;
        aVar12.m128 = (__m128)minps(aVar12.m128,*(undefined1 (*) [16])(psVar8 + -0x289));
        aVar11.m128 = (__m128)maxps(aVar11.m128,*(undefined1 (*) [16])(psVar8 + -0x287));
        aVar9.m128 = (__m128)minps(aVar9.m128,*(undefined1 (*) [16])(psVar8 + -0x285));
        aVar10.m128 = (__m128)maxps(aVar10.m128,*(undefined1 (*) [16])(psVar8 + -0x283));
        sVar13 = sVar13 + psVar8[-0x281];
        sVar14 = sVar14 + psVar8[-0x280];
        psVar8 = psVar8 + 10;
        local_2938 = local_2938 - 1;
      } while (local_2938 != 0);
    }
    (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0
         = aVar12;
    (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0
         = aVar11;
    (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0
         = aVar9;
    (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0
         = aVar10;
    __return_storage_ptr__->begin = sVar13;
    __return_storage_ptr__->end = sVar14;
  }
  return __return_storage_ptr__;
}

Assistant:

PrimInfo createPrimRefArray_presplit(Geometry* geometry, unsigned int geomID, size_t numPrimRefs, mvector<PrimRef>& prims, BuildProgressMonitor& progressMonitor)
    {
      ParallelPrefixSumState<PrimInfo> pstate;
      
      /* first try */
      progressMonitor(0);
      PrimInfo pinfo = parallel_prefix_sum( pstate, size_t(0), geometry->size(), size_t(1024), PrimInfo(empty), [&](const range<size_t>& r, const PrimInfo& base) -> PrimInfo {
	  return geometry->createPrimRefArray(prims,r,r.begin(),geomID);
	}, [](const PrimInfo& a, const PrimInfo& b) -> PrimInfo { return PrimInfo::merge(a,b); });

      /* if we need to filter out geometry, run again */
      if (pinfo.size() != numPrimRefs)
	{
	  progressMonitor(0);
	  pinfo = parallel_prefix_sum( pstate, size_t(0), geometry->size(), size_t(1024), PrimInfo(empty), [&](const range<size_t>& r, const PrimInfo& base) -> PrimInfo {
	      return geometry->createPrimRefArray(prims,r,base.size(),geomID);
	    }, [](const PrimInfo& a, const PrimInfo& b) -> PrimInfo { return PrimInfo::merge(a,b); });
	}
      return pinfo;	
    }